

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printShiftImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  MCOperand *op;
  ulong uVar2;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  uint Amt;
  _Bool isASR;
  uint ShiftOp;
  uint local_2c;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  uVar2 = MCOperand_getImm(op);
  local_2c = (uint)uVar2 & 0x1f;
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x1f) != 0) {
      if (local_2c < 10) {
        SStream_concat(in_RDX,", lsl #%u",(ulong)local_2c);
      }
      else {
        SStream_concat(in_RDX,", lsl #0x%x",(ulong)local_2c);
      }
      if (in_RDI->csh->detail != CS_OPT_OFF) {
        puVar1 = in_RDI->flat_insn->detail->groups +
                 (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        *(uint *)(in_RDI->flat_insn->detail->groups +
                 (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d) =
             local_2c;
      }
    }
  }
  else {
    if ((uVar2 & 0x1f) == 0) {
      local_2c = 0x20;
    }
    if (local_2c < 10) {
      SStream_concat(in_RDX,", asr #%u",(ulong)local_2c);
    }
    else {
      SStream_concat(in_RDX,", asr #0x%x",(ulong)local_2c);
    }
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (long)(int)((in_RDI->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d) =
           local_2c;
    }
  }
  return;
}

Assistant:

static void printShiftImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned ShiftOp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool isASR = (ShiftOp & (1 << 5)) != 0;
	unsigned Amt = ShiftOp & 0x1f;
	if (isASR) {
		unsigned tmp = Amt == 0 ? 32 : Amt;
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, ", asr #0x%x", tmp);
		else
			SStream_concat(O, ", asr #%u", tmp);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ASR;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
		}
	} else if (Amt) {
		if (Amt > HEX_THRESHOLD)
			SStream_concat(O, ", lsl #0x%x", Amt);
		else
			SStream_concat(O, ", lsl #%u", Amt);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_LSL;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Amt;
		}
	}
}